

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

ShapeRange * __thiscall
CoreML::ShapeRange::operator+(ShapeRange *__return_storage_ptr__,ShapeRange *this,size_t val)

{
  RangeValue RVar1;
  RangeValue local_30;
  
  ShapeRange(__return_storage_ptr__);
  RVar1 = RangeValue::operator+(&this->_minimum,val);
  local_30._val = RVar1._val;
  local_30._isUnbound = RVar1._isUnbound;
  setLower(__return_storage_ptr__,&local_30);
  RVar1 = RangeValue::operator+(&this->_maximum,val);
  local_30._val = RVar1._val;
  local_30._isUnbound = RVar1._isUnbound;
  setUpper(__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::operator+ (size_t val) const {
    ShapeRange out;
    out.setLower(_minimum + val);
    out.setUpper(_maximum + val);
    return out;
}